

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>
fmt::v8::detail::
write_ptr<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned_long>
          (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out,unsigned_long value,
          basic_format_specs<char32_t> *specs)

{
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  int *piVar4;
  unsigned_long uVar5;
  char32_t *pcVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  anon_class_16_2_92d121e5 write;
  anon_class_16_2_92d121e5 local_48;
  char local_38 [24];
  
  lVar9 = -4;
  uVar5 = value;
  lVar11 = 0;
  do {
    lVar10 = lVar11;
    lVar9 = lVar9 + 4;
    lVar11 = lVar10 + 1;
    bVar12 = 0xf < uVar5;
    uVar5 = uVar5 >> 4;
  } while (bVar12);
  local_48.num_digits = (int)lVar11;
  local_48.value = value;
  if (specs == (basic_format_specs<char32_t> *)0x0) {
    sVar1 = (out.container)->size_;
    uVar7 = (out.container)->capacity_;
    uVar8 = sVar1 + 1;
    if (uVar7 < uVar8) {
      (**(out.container)->_vptr_buffer)(out.container);
      sVar1 = (out.container)->size_;
      uVar7 = (out.container)->capacity_;
      uVar8 = sVar1 + 1;
    }
    pcVar6 = (out.container)->ptr_;
    (out.container)->size_ = uVar8;
    pcVar6[sVar1] = L'0';
    uVar2 = uVar8 + 1;
    if (uVar7 < uVar2) {
      (**(out.container)->_vptr_buffer)(out.container,uVar2);
      pcVar6 = (out.container)->ptr_;
      uVar8 = (out.container)->size_;
      uVar2 = uVar8 + 1;
    }
    (out.container)->size_ = uVar2;
    pcVar6[uVar8] = L'x';
    if ((out.container)->capacity_ < uVar2 + lVar11) {
      pcVar3 = local_38 + lVar10;
      do {
        *pcVar3 = "0123456789abcdef"[(uint)value & 0xf];
        pcVar3 = pcVar3 + -1;
        bVar12 = 0xf < value;
        value = value >> 4;
      } while (bVar12);
      out = copy_str_noinline<char32_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
                      (local_38,local_38 + lVar10 + 1,out);
    }
    else {
      (out.container)->size_ = uVar2 + lVar11;
      piVar4 = (int *)((long)pcVar6 + lVar9 + uVar2 * 4);
      do {
        *piVar4 = (int)"0123456789abcdef"[(uint)value & 0xf];
        piVar4 = piVar4 + -1;
        bVar12 = 0xf < value;
        value = value >> 4;
      } while (bVar12);
    }
  }
  else {
    out = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_ptr<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned_long,fmt::v8::basic_format_specs<char32_t>const*)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_1_&>
                    (out,specs,lVar10 + 3U,lVar10 + 3U,&local_48);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)out.container;
}

Assistant:

auto write_ptr(OutputIt out, UIntPtr value,
               const basic_format_specs<Char>* specs) -> OutputIt {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  auto write = [=](reserve_iterator<OutputIt> it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}